

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

ztast_value_t * ztast_value_nil(ztast_t *ast)

{
  ztast_value_t *pzVar1;
  
  pzVar1 = (ztast_value_t *)(*ast->mallocfn)(8,ast->opaque);
  if (pzVar1 != (ztast_value_t *)0x0) {
    pzVar1->type = ZTVAL_NIL;
  }
  return pzVar1;
}

Assistant:

ztast_value_t *ztast_value_nil(ztast_t *ast)
{
  ztast_value_t *val;

  assert(ast);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_value_nil\n");
#endif

  val = ZTAST_MALLOC(sizeof(*val));
  if (val == NULL)
    return NULL;

  val->type = ZTVAL_NIL;

  return val;
}